

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

void __thiscall
cmComputeTargetDepends::AddTargetDepend
          (cmComputeTargetDepends *this,int depender_index,cmGeneratorTarget *dependee,
          cmListFileBacktrace *dependee_backtrace,bool linking,bool cross)

{
  bool bVar1;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *this_00;
  reference pcVar2;
  pointer ppVar3;
  vector<cmGraphEdge,std::allocator<cmGraphEdge>> *this_01;
  bool local_75;
  int local_74;
  iterator iStack_70;
  int dependee_index;
  _Self local_68;
  iterator tii;
  cmGeneratorTarget *transitive_dependee;
  cmLinkItem *i;
  iterator __end2;
  iterator __begin2;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *__range2;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *utils;
  bool cross_local;
  cmListFileBacktrace *pcStack_28;
  bool linking_local;
  cmListFileBacktrace *dependee_backtrace_local;
  cmGeneratorTarget *dependee_local;
  cmComputeTargetDepends *pcStack_10;
  int depender_index_local;
  cmComputeTargetDepends *this_local;
  
  utils._6_1_ = cross;
  utils._7_1_ = linking;
  pcStack_28 = dependee_backtrace;
  dependee_backtrace_local = (cmListFileBacktrace *)dependee;
  dependee_local._4_4_ = depender_index;
  pcStack_10 = this;
  bVar1 = cmGeneratorTarget::IsInBuildSystem(dependee);
  if (bVar1) {
    local_68._M_node =
         (_Base_ptr)
         std::
         map<const_cmGeneratorTarget_*,_int,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_int>_>_>
         ::find(&this->TargetIndex,(key_type *)&dependee_backtrace_local);
    iStack_70 = std::
                map<const_cmGeneratorTarget_*,_int,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_int>_>_>
                ::end(&this->TargetIndex);
    bVar1 = std::operator!=(&local_68,&stack0xffffffffffffff90);
    if (!bVar1) {
      __assert_fail("tii != this->TargetIndex.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmComputeTargetDepends.cxx"
                    ,0x19e,
                    "void cmComputeTargetDepends::AddTargetDepend(int, const cmGeneratorTarget *, const cmListFileBacktrace &, bool, bool)"
                   );
    }
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_int>_>::operator->
                       (&local_68);
    local_74 = ppVar3->second;
    this_01 = (vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
              std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                        (&(this->InitialGraph).
                          super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                         (long)dependee_local._4_4_);
    local_75 = (bool)((utils._7_1_ ^ 0xff) & 1);
    std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
    emplace_back<int&,bool,bool&,cmListFileBacktrace_const&>
              (this_01,&local_74,&local_75,(bool *)((long)&utils + 6),pcStack_28);
  }
  else {
    this_00 = cmGeneratorTarget::GetUtilityItems((cmGeneratorTarget *)dependee_backtrace_local);
    __end2 = std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::begin
                       (this_00);
    i = (cmLinkItem *)
        std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::end(this_00);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&i), bVar1) {
      pcVar2 = std::_Rb_tree_const_iterator<cmLinkItem>::operator*(&__end2);
      tii._M_node = (_Base_ptr)pcVar2->Target;
      if ((cmGeneratorTarget *)tii._M_node != (cmGeneratorTarget *)0x0) {
        AddTargetDepend(this,dependee_local._4_4_,(cmGeneratorTarget *)tii._M_node,
                        &pcVar2->Backtrace,false,(bool)(pcVar2->Cross & 1));
      }
      std::_Rb_tree_const_iterator<cmLinkItem>::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void cmComputeTargetDepends::AddTargetDepend(
  int depender_index, cmGeneratorTarget const* dependee,
  cmListFileBacktrace const& dependee_backtrace, bool linking, bool cross)
{
  if (!dependee->IsInBuildSystem()) {
    // Skip targets that are not in the buildsystem but follow their
    // utility dependencies.
    std::set<cmLinkItem> const& utils = dependee->GetUtilityItems();
    for (cmLinkItem const& i : utils) {
      if (cmGeneratorTarget const* transitive_dependee = i.Target) {
        this->AddTargetDepend(depender_index, transitive_dependee, i.Backtrace,
                              false, i.Cross);
      }
    }
  } else {
    // Lookup the index for this target.  All targets should be known by
    // this point.
    auto tii = this->TargetIndex.find(dependee);
    assert(tii != this->TargetIndex.end());
    int dependee_index = tii->second;

    // Add this entry to the dependency graph.
    this->InitialGraph[depender_index].emplace_back(dependee_index, !linking,
                                                    cross, dependee_backtrace);
  }
}